

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlIsPubidChar(void)

{
  int iVar1;
  uint val;
  int iVar2;
  int local_1c;
  int n_ch;
  uint ch;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
    iVar1 = xmlMemBlocks();
    val = gen_unsigned_int(local_1c,0);
    iVar2 = xmlIsPubidChar(val);
    desret_int(iVar2);
    call_tests = call_tests + 1;
    des_unsigned_int(local_1c,val,0);
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar1 != iVar2) {
      iVar2 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlIsPubidChar",(ulong)(uint)(iVar2 - iVar1));
      ret_val = ret_val + 1;
      printf(" %d");
      printf("\n");
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlIsPubidChar(void) {
    int test_ret = 0;

    int mem_base;
    int ret_val;
    unsigned int ch; /* character to validate */
    int n_ch;

    for (n_ch = 0;n_ch < gen_nb_unsigned_int;n_ch++) {
        mem_base = xmlMemBlocks();
        ch = gen_unsigned_int(n_ch, 0);

        ret_val = xmlIsPubidChar(ch);
        desret_int(ret_val);
        call_tests++;
        des_unsigned_int(n_ch, ch, 0);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlIsPubidChar",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_ch);
            printf("\n");
        }
    }
    function_tests++;

    return(test_ret);
}